

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

UniquePtr<GENERAL_NAME> __thiscall
anon_unknown.dwarf_b4327e::MakeGeneralName(anon_unknown_dwarf_b4327e *this,int type,string *value)

{
  _Head_base<0UL,_asn1_string_st_*,_false> _Var1;
  int iVar2;
  UniquePtr<ASN1_IA5STRING> str;
  UniquePtr<GENERAL_NAME> name;
  _Head_base<0UL,_asn1_string_st_*,_false> local_28;
  _Head_base<0UL,_GENERAL_NAME_st_*,_false> local_20;
  
  if (((uint)type < 7) && ((0x46U >> (type & 0x1fU) & 1) != 0)) {
    local_28._M_head_impl = (asn1_string_st *)ASN1_IA5STRING_new();
    local_20._M_head_impl = (GENERAL_NAME_st *)GENERAL_NAME_new();
    if (((GENERAL_NAME *)local_20._M_head_impl == (GENERAL_NAME *)0x0 ||
         local_28._M_head_impl == (asn1_string_st *)0x0) ||
       (iVar2 = ASN1_STRING_set((ASN1_STRING *)local_28._M_head_impl,(value->_M_dataplus)._M_p,
                                (int)value->_M_string_length),
       _Var1._M_head_impl = local_28._M_head_impl, iVar2 == 0)) {
      *(undefined8 *)this = 0;
    }
    else {
      (local_20._M_head_impl)->type = type;
      local_28._M_head_impl = (asn1_string_st *)0x0;
      ((_union_851 *)&(local_20._M_head_impl)->d)->rfc822Name = (ASN1_IA5STRING *)_Var1._M_head_impl
      ;
      *(GENERAL_NAME_st **)this = local_20._M_head_impl;
      local_20._M_head_impl = (GENERAL_NAME_st *)0x0;
    }
    std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter> *)&local_20);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_28);
    return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<GENERAL_NAME> MakeGeneralName(int type,
                                                     const std::string &value) {
  if (type != GEN_EMAIL && type != GEN_DNS && type != GEN_URI) {
    // This function only supports the IA5String types.
    return nullptr;
  }
  bssl::UniquePtr<ASN1_IA5STRING> str(ASN1_IA5STRING_new());
  bssl::UniquePtr<GENERAL_NAME> name(GENERAL_NAME_new());
  if (!str || !name ||
      !ASN1_STRING_set(str.get(), value.data(), value.size())) {
    return nullptr;
  }

  name->type = type;
  name->d.ia5 = str.release();
  return name;
}